

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tracker_manager.cpp
# Opt level: O2

void __thiscall
libtorrent::aux::tracker_manager::tracker_manager
          (tracker_manager *this,send_fun_t *send_fun,send_fun_hostname_t *send_fun_hostname,
          counters *stats_counters,resolver_interface *resolver,session_settings *sett,
          session_logger *ses)

{
  (this->m_udp_conns)._M_h._M_buckets = &(this->m_udp_conns)._M_h._M_single_bucket;
  (this->m_udp_conns)._M_h._M_bucket_count = 1;
  (this->m_udp_conns)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->m_udp_conns)._M_h._M_element_count = 0;
  (this->m_udp_conns)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->m_udp_conns)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->m_udp_conns)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->m_http_conns).
  super__Vector_base<std::shared_ptr<libtorrent::aux::http_tracker_connection>,_std::allocator<std::shared_ptr<libtorrent::aux::http_tracker_connection>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_http_conns).
  super__Vector_base<std::shared_ptr<libtorrent::aux::http_tracker_connection>,_std::allocator<std::shared_ptr<libtorrent::aux::http_tracker_connection>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_http_conns).
  super__Vector_base<std::shared_ptr<libtorrent::aux::http_tracker_connection>,_std::allocator<std::shared_ptr<libtorrent::aux::http_tracker_connection>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  ::std::
  _Deque_base<std::shared_ptr<libtorrent::aux::http_tracker_connection>,_std::allocator<std::shared_ptr<libtorrent::aux::http_tracker_connection>_>_>
  ::_Deque_base(&(this->m_queued).
                 super__Deque_base<std::shared_ptr<libtorrent::aux::http_tracker_connection>,_std::allocator<std::shared_ptr<libtorrent::aux::http_tracker_connection>_>_>
               );
  ::std::
  function<void_(const_libtorrent::aux::listen_socket_handle_&,_const_boost::asio::ip::basic_endpoint<boost::asio::ip::udp>_&,_libtorrent::span<const_char>,_boost::system::error_code_&,_libtorrent::flags::bitfield_flag<unsigned_char,_libtorrent::aux::udp_send_flags_tag,_void>)>
  ::function(&this->m_send_fun,send_fun);
  ::std::
  function<void_(const_libtorrent::aux::listen_socket_handle_&,_const_char_*,_int,_libtorrent::span<const_char>,_boost::system::error_code_&,_libtorrent::flags::bitfield_flag<unsigned_char,_libtorrent::aux::udp_send_flags_tag,_void>)>
  ::function(&this->m_send_fun_hostname,send_fun_hostname);
  this->m_host_resolver = resolver;
  this->m_settings = sett;
  this->m_stats_counters = stats_counters;
  this->m_abort = false;
  this->m_ses = ses;
  return;
}

Assistant:

tracker_manager::tracker_manager(send_fun_t send_fun
		, send_fun_hostname_t send_fun_hostname
		, counters& stats_counters
		, aux::resolver_interface& resolver
		, aux::session_settings const& sett
#if !defined TORRENT_DISABLE_LOGGING || TORRENT_USE_ASSERTS
		, aux::session_logger& ses
#endif
		)
		: m_send_fun(std::move(send_fun))
		, m_send_fun_hostname(std::move(send_fun_hostname))
		, m_host_resolver(resolver)
		, m_settings(sett)
		, m_stats_counters(stats_counters)
#if !defined TORRENT_DISABLE_LOGGING || TORRENT_USE_ASSERTS
		, m_ses(ses)
#endif
	{}